

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

size_t __thiscall clickhouse::ArrayInput::DoNext(ArrayInput *this,void **ptr,size_t len)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  undefined8 *in_RSI;
  long in_RDI;
  unsigned_long local_18;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  puVar2 = std::min<unsigned_long>((unsigned_long *)(in_RDI + 0x10),&local_18);
  uVar1 = *puVar2;
  *local_10 = *(undefined8 *)(in_RDI + 8);
  *(unsigned_long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - uVar1;
  *(unsigned_long *)(in_RDI + 8) = uVar1 + *(long *)(in_RDI + 8);
  return uVar1;
}

Assistant:

size_t ArrayInput::DoNext(const void** ptr, size_t len) {
    len = std::min(len_, len);

    *ptr   = data_;
    len_  -= len;
    data_ += len;

    return len;
}